

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O2

void pbrt::ply::parse(string *fileName,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pos,
                     vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *nor,
                     vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *tex,
                     vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *idx)

{
  char *pcVar1;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *pvVar2;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *pvVar3;
  bool bVar4;
  int iVar5;
  p_ply_conflict ply;
  p_ply_element_conflict last;
  p_ply_property_conflict ptVar6;
  undefined8 uVar7;
  undefined4 extraout_var_00;
  undefined7 uVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  runtime_error *prVar8;
  uint uVar10;
  byte bVar11;
  bool bVar12;
  char *property_name;
  size_type local_e8;
  char *local_e0;
  char *pname;
  size_type local_b0;
  ulong local_a8;
  vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_> *local_a0;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_98;
  vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_> *local_90;
  vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_> *local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  char *local_50;
  long instance_count;
  p_ply_conflict local_40;
  char *name;
  undefined4 extraout_var;
  
  local_98 = nor;
  local_88 = pos;
  ply = ply_open((fileName->_M_dataplus)._M_p,(p_ply_error_cb)0x0,0,(void *)0x0);
  if (ply == (p_ply_conflict)0x0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pname,
                   "Couldn\'t open PLY file ",fileName);
    std::runtime_error::runtime_error(prVar8,pname);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_a0 = idx;
  local_90 = tex;
  iVar5 = ply_read_header(ply);
  if (iVar5 == 0) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pname,
                   "Unable to read the header of PLY file ",fileName);
    std::runtime_error::runtime_error(prVar8,pname);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_e8 = 0;
  local_b0 = 0;
  uVar10 = 0;
  local_a8 = 0;
  local_e0 = (char *)0x0;
  property_name = (char *)0x0;
  local_50 = (char *)0x0;
  last = (p_ply_element_conflict)0x0;
  local_40 = ply;
  bVar11 = 0;
LAB_00147ac9:
  do {
    do {
      last = ply_get_next_element(ply,last);
      if (last == (p_ply_element_conflict)0x0) {
        if ((local_e8 == 0) || (local_b0 == 0)) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pname
                         ,fileName,": PLY file is invalid! No face/vertex elements found!");
          std::runtime_error::runtime_error(prVar8,(string *)&pname);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
                  (local_88,local_e8);
        pvVar3 = local_90;
        if ((uVar10 & 1) != 0) {
          std::vector<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>::resize
                    (local_98,local_e8);
        }
        if ((bVar11 & 1) != 0) {
          std::vector<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>::resize
                    (pvVar3,local_e8);
        }
        if ((local_a8 & 1) != 0) {
          std::vector<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>::resize
                    (local_a0,local_b0);
        }
        pvVar2 = local_88;
        ply_set_read_cb(ply,"vertex","x",rply_vertex_callback_vec3,
                        (local_88->
                        super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>).
                        _M_impl.super__Vector_impl_data._M_start,0);
        ply_set_read_cb(ply,"vertex","y",rply_vertex_callback_vec3,
                        &((pvVar2->
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->y,0);
        ply_set_read_cb(ply,"vertex","z",rply_vertex_callback_vec3,
                        &((pvVar2->
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)
                          ._M_impl.super__Vector_impl_data._M_start)->z,0);
        pvVar2 = local_98;
        if ((uVar10 & 1) != 0) {
          ply_set_read_cb(ply,"vertex","nx",rply_vertex_callback_vec3,
                          (local_98->
                          super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>)
                          ._M_impl.super__Vector_impl_data._M_start,0);
          ply_set_read_cb(ply,"vertex","ny",rply_vertex_callback_vec3,
                          &((pvVar2->
                            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                            )._M_impl.super__Vector_impl_data._M_start)->y,0);
          ply_set_read_cb(ply,"vertex","nz",rply_vertex_callback_vec3,
                          &((pvVar2->
                            super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>
                            )._M_impl.super__Vector_impl_data._M_start)->z,0);
        }
        pvVar3 = local_90;
        if ((bVar11 & 1) != 0) {
          ply_set_read_cb(ply,"vertex",local_e0,rply_vertex_callback_vec2,
                          (local_90->
                          super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>)
                          ._M_impl.super__Vector_impl_data._M_start,0);
          ply_set_read_cb(ply,"vertex",property_name,rply_vertex_callback_vec2,
                          &((pvVar3->
                            super__Vector_base<pbrt::math::vec2f,_std::allocator<pbrt::math::vec2f>_>
                            )._M_impl.super__Vector_impl_data._M_start)->y,0);
        }
        if ((local_a8 & 1) != 0) {
          ply_set_read_cb(ply,"face",local_50,rply_face_callback,
                          (local_a0->
                          super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>)
                          ._M_impl.super__Vector_impl_data._M_start,0);
        }
        iVar5 = ply_read(ply);
        ply_close(ply);
        if (iVar5 != 0) {
          return;
        }
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pname,
                       fileName,": unable to read the contents of PLY file");
        std::runtime_error::runtime_error(prVar8,(string *)&pname);
        __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ply_get_element_info(last,&name,&instance_count);
      pcVar1 = name;
      iVar5 = strcmp(name,"vertex");
      if (iVar5 == 0) {
        local_e8 = instance_count;
        bVar4 = false;
        local_60 = 0;
        local_68 = 0;
        local_70 = 0;
        local_78 = 0;
        local_80 = 0;
        bVar12 = false;
        local_58 = 0;
        ptVar6 = (p_ply_property_conflict)0x0;
LAB_00147c01:
        ptVar6 = ply_get_next_property(last,ptVar6);
        if (ptVar6 == (p_ply_property_conflict)0x0) goto LAB_00147d76;
        ply_get_property_info(ptVar6,&pname,(e_ply_type *)0x0,(e_ply_type *)0x0,(e_ply_type *)0x0);
        pcVar1 = pname;
        bVar11 = *pname;
        uVar9 = (undefined7)
                ((ulong)((long)&switchD_00147c4f::switchdataD_0016824c +
                        (long)(int)(&switchD_00147c4f::switchdataD_0016824c)[bVar11 - 0x6e]) >> 8);
        switch((uint)bVar11) {
        case 0x6e:
          if ((pname[1] == 'x') && (pname[2] == '\0')) {
            local_70 = CONCAT71(uVar9,1);
            goto LAB_00147c01;
          }
          if ((pname[1] == 'y') && (pname[2] == '\0')) {
            local_78 = CONCAT71(uVar9,1);
            goto LAB_00147c01;
          }
          if ((pname[1] == 'z') && (pname[2] == '\0')) {
            local_80 = CONCAT71(uVar9,1);
            goto LAB_00147c01;
          }
          break;
        case 0x73:
        case 0x75:
          if (pname[1] == '\0') {
            bVar12 = true;
            local_e0 = pname;
            goto LAB_00147c01;
          }
          break;
        case 0x78:
          if (pname[1] == '\0') {
            bVar4 = true;
            goto LAB_00147c01;
          }
          break;
        case 0x79:
          if (pname[1] == '\0') {
            local_60 = CONCAT71(uVar9,1);
            goto LAB_00147c01;
          }
          break;
        case 0x7a:
          if (pname[1] != '\0') break;
          local_68 = CONCAT71(uVar9,1);
          goto LAB_00147c01;
        }
        iVar5 = strcmp(pname,"texture_u");
        if (iVar5 != 0) {
          iVar5 = strcmp(pcVar1,"texture_s");
          uVar7 = CONCAT44(extraout_var_01,iVar5);
          if (iVar5 != 0) {
            if (((bVar11 != 0x74) && (bVar11 != 0x76)) || (pcVar1[1] != '\0')) {
              iVar5 = strcmp(pcVar1,"texture_v");
              uVar7 = CONCAT44(extraout_var_02,iVar5);
              if (iVar5 != 0) {
                iVar5 = strcmp(pcVar1,"texture_t");
                uVar7 = CONCAT44(extraout_var_03,iVar5);
                if (iVar5 != 0) goto LAB_00147c01;
              }
            }
            local_58 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
            property_name = pcVar1;
            goto LAB_00147c01;
          }
        }
        local_e0 = pcVar1;
        bVar12 = true;
        goto LAB_00147c01;
      }
      iVar5 = strcmp(pcVar1,"face");
    } while (iVar5 != 0);
    local_b0 = instance_count;
    ptVar6 = (p_ply_property_conflict)0x0;
LAB_00147b3a:
    ptVar6 = ply_get_next_property(last,ptVar6);
    if (ptVar6 != (p_ply_property_conflict)0x0) {
      ply_get_property_info(ptVar6,&pname,(e_ply_type *)0x0,(e_ply_type *)0x0,(e_ply_type *)0x0);
      pcVar1 = pname;
      iVar5 = strcmp(pname,"vertex_index");
      uVar7 = CONCAT44(extraout_var,iVar5);
      if (iVar5 != 0) goto code_r0x00147b7d;
      goto LAB_00147b90;
    }
  } while( true );
LAB_00147d76:
  if (((!bVar4) || ((local_60 & 1) == 0)) || ((local_68 & 1) == 0)) {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pname,
                   fileName,": Vertex coordinate property not found!");
    std::runtime_error::runtime_error(prVar8,(string *)&pname);
    __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  uVar10 = (uint)local_80 & 0xff;
  if (((byte)local_70 & (byte)local_78 & 1) == 0) {
    uVar10 = 0;
  }
  ply = local_40;
  bVar11 = (byte)local_58;
  if (!bVar12) {
    bVar11 = 0;
  }
  goto LAB_00147ac9;
code_r0x00147b7d:
  iVar5 = strcmp(pcVar1,"vertex_indices");
  uVar7 = CONCAT44(extraout_var_00,iVar5);
  if (iVar5 == 0) {
LAB_00147b90:
    local_a8 = CONCAT71((int7)((ulong)uVar7 >> 8),1);
    local_50 = pcVar1;
  }
  goto LAB_00147b3a;
}

Assistant:

void parse(const std::string &fileName,
      std::vector<vec3f> &pos,
      std::vector<vec3f> &nor,
      std::vector<vec2f> &tex,
      std::vector<vec3i> &idx)
    {
      p_ply ply = ply_open(fileName.c_str(), nullptr, 0, nullptr);
      if (!ply)
        throw std::runtime_error(std::string("Couldn't open PLY file " + fileName).c_str());

      if (!ply_read_header(ply))
        throw std::runtime_error(std::string("Unable to read the header of PLY file " + fileName).c_str());

      long vertex_count = 0;
      long face_count = 0;
      bool has_normals = false;
      bool has_uvs = false;
      bool has_indices = false;
      const char* tex_coord_u_name = nullptr;
      const char* tex_coord_v_name = nullptr;
      const char* vertex_indices_name = nullptr;

      // Inspect structure of the PLY file.
      p_ply_element element = nullptr;
      while ((element = ply_get_next_element(ply, element)) != nullptr) {
        const char* name;
        long instance_count;
        ply_get_element_info(element, &name, &instance_count);

        // Check for vertex element.
        if (strcmp(name, "vertex") == 0) {
          vertex_count = instance_count;

          bool has_position_components[3] = {false};
          bool has_normal_components[3] = {false};
          bool has_uv_components[2] = {false};
         
          // Inspect vertex properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);

            if (!strcmp(pname, "x"))
              has_position_components[0] = true;
            else if (!strcmp(pname, "y"))
              has_position_components[1] = true;
            else if (!strcmp(pname, "z"))
              has_position_components[2] = true;
            else if (!strcmp(pname, "nx"))
              has_normal_components[0] = true;
            else if (!strcmp(pname, "ny"))
              has_normal_components[1] = true;
            else if (!strcmp(pname, "nz"))
              has_normal_components[2] = true;
            else if (!strcmp(pname, "u") || !strcmp(pname, "s") || !strcmp(pname, "texture_u") || !strcmp(pname, "texture_s")) {
              has_uv_components[0] = true;
              tex_coord_u_name = pname;
            }
            else if (!strcmp(pname, "v") || !strcmp(pname, "t") || !strcmp(pname, "texture_v") || !strcmp(pname, "texture_t")) {
              has_uv_components[1] = true;
              tex_coord_v_name = pname;
            }
          }

          if (!(has_position_components[0] && has_position_components[1] && has_position_components[2]))
            throw std::runtime_error(fileName + ": Vertex coordinate property not found!");

          has_normals = has_normal_components[0] && has_normal_components[1] && has_normal_components[2];
          has_uvs = has_uv_components[0] && has_uv_components[1];
        }

        // Check for face element.
        else if (strcmp(name, "face") == 0) {
          face_count = instance_count;

          // Inspect face properties.
          p_ply_property property = nullptr;
          while ((property = ply_get_next_property(element, property)) != nullptr) {
            const char* pname;
            ply_get_property_info(property, &pname, nullptr, nullptr, nullptr);
            if (!strcmp(pname, "vertex_index") || !strcmp(pname, "vertex_indices")) {
              has_indices = true;
              vertex_indices_name = pname;
            }
          }
        }
      }

      if (vertex_count == 0 || face_count == 0)
        throw std::runtime_error(fileName + ": PLY file is invalid! No face/vertex elements found!");

      pos.resize(vertex_count);
      if (has_normals)
        nor.resize(vertex_count);
      if (has_uvs)
        tex.resize(vertex_count);
      if (has_indices)
        idx.resize(face_count);

      // Set callbacks to process the PLY properties.
      ply_set_read_cb(ply, "vertex", "x", rply_vertex_callback_vec3, &pos[0].x, 0);
      ply_set_read_cb(ply, "vertex", "y", rply_vertex_callback_vec3, &pos[0].y, 0);
      ply_set_read_cb(ply, "vertex", "z", rply_vertex_callback_vec3, &pos[0].z, 0);

      if (has_normals) {
        ply_set_read_cb(ply, "vertex", "nx", rply_vertex_callback_vec3, &nor[0].x, 0);
        ply_set_read_cb(ply, "vertex", "ny", rply_vertex_callback_vec3, &nor[0].y, 0);
        ply_set_read_cb(ply, "vertex", "nz", rply_vertex_callback_vec3, &nor[0].z, 0);
      }

      if (has_uvs) {
        ply_set_read_cb(ply, "vertex", tex_coord_u_name, rply_vertex_callback_vec2, &tex[0].x, 0);
        ply_set_read_cb(ply, "vertex", tex_coord_v_name, rply_vertex_callback_vec2, &tex[0].y, 0);
      }

      if (has_indices) {
        ply_set_read_cb(ply, "face", vertex_indices_name, rply_face_callback, &idx[0].x, 0);
      }

      // Read ply file.
      if (!ply_read(ply)) {
        ply_close(ply);
        throw std::runtime_error(fileName + ": unable to read the contents of PLY file");
      }
      ply_close(ply);
    }